

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instanceid.c
# Opt level: O0

LY_ERR lyplg_type_store_instanceid
                 (ly_ctx *ctx,lysc_type *type,void *value,size_t value_len,uint32_t options,
                 LY_VALUE_FORMAT format,void *prefix_data,uint32_t hints,lysc_node *ctx_node,
                 lyd_value *storage,lys_glob_unres *unres,ly_err_item **err)

{
  char *local_60;
  char *canon;
  ly_path *path;
  lysc_type_instanceid *type_inst;
  LY_VALUE_FORMAT local_40;
  LY_ERR ret;
  LY_VALUE_FORMAT format_local;
  uint32_t options_local;
  size_t value_len_local;
  void *value_local;
  lysc_type *type_local;
  ly_ctx *ctx_local;
  
  type_inst._4_4_ = 0;
  path = (ly_path *)type;
  local_40 = format;
  ret = options;
  _format_local = value_len;
  value_len_local = (size_t)value;
  value_local = type;
  type_local = (lysc_type *)ctx;
  memset(storage,0,0x28);
  storage->realtype = (lysc_type *)value_local;
  type_inst._4_4_ =
       lyplg_type_check_hints
                 (hints,(char *)value_len_local,_format_local,
                  *(LY_DATA_TYPE *)((long)value_local + 0x18),(int *)0x0,err);
  if (type_inst._4_4_ == LY_SUCCESS) {
    if (local_40 == LY_VALUE_LYB) {
      type_inst._4_4_ =
           lyplg_type_lypath_new
                     ((ly_ctx *)type_local,(char *)value_len_local,_format_local,ret,LY_VALUE_JSON,
                      prefix_data,ctx_node,unres,(ly_path **)&canon,err);
    }
    else {
      type_inst._4_4_ =
           lyplg_type_lypath_new
                     ((ly_ctx *)type_local,(char *)value_len_local,_format_local,ret,local_40,
                      prefix_data,ctx_node,unres,(ly_path **)&canon,err);
    }
    if (type_inst._4_4_ == LY_SUCCESS) {
      (storage->field_2).enum_item = (lysc_type_bitenum_item *)canon;
      type_inst._4_4_ =
           lyplg_type_lypath_check_status(ctx_node,(ly_path *)canon,local_40,prefix_data,err);
      if (type_inst._4_4_ == LY_SUCCESS) {
        if (local_40 == LY_VALUE_CANON) {
          if ((ret & LY_EMEM) == LY_SUCCESS) {
            type_inst._4_4_ =
                 lydict_insert((ly_ctx *)type_local,(char *)value_len_local,_format_local,
                               &storage->_canonical);
          }
          else {
            type_inst._4_4_ =
                 lydict_insert_zc((ly_ctx *)type_local,(char *)value_len_local,&storage->_canonical)
            ;
            ret = ret & ~LY_EMEM;
          }
        }
        else {
          type_inst._4_4_ =
               instanceid_path2str((ly_path *)canon,LY_VALUE_JSON,(void *)0x0,&local_60);
          if (type_inst._4_4_ == LY_SUCCESS) {
            type_inst._4_4_ = lydict_insert_zc((ly_ctx *)type_local,local_60,&storage->_canonical);
          }
        }
      }
    }
  }
  if ((ret & LY_EMEM) != LY_SUCCESS) {
    free((void *)value_len_local);
  }
  if (type_inst._4_4_ != LY_SUCCESS) {
    lyplg_type_free_instanceid((ly_ctx *)type_local,storage);
  }
  if ((type_inst._4_4_ == LY_SUCCESS) && (*(char *)&path[1].ext != '\0')) {
    ctx_local._4_4_ = LY_EINCOMPLETE;
  }
  else {
    ctx_local._4_4_ = type_inst._4_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_type_store_instanceid(const struct ly_ctx *ctx, const struct lysc_type *type, const void *value, size_t value_len,
        uint32_t options, LY_VALUE_FORMAT format, void *prefix_data, uint32_t hints, const struct lysc_node *ctx_node,
        struct lyd_value *storage, struct lys_glob_unres *unres, struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysc_type_instanceid *type_inst = (struct lysc_type_instanceid *)type;
    struct ly_path *path;
    char *canon;

    /* init storage */
    memset(storage, 0, sizeof *storage);
    storage->realtype = type;

    /* check hints */
    ret = lyplg_type_check_hints(hints, value, value_len, type->basetype, NULL, err);
    LY_CHECK_GOTO(ret, cleanup);

    /* compile instance-identifier into path */
    if (format == LY_VALUE_LYB) {
        /* value in LYB format is the same as in JSON format. */
        ret = lyplg_type_lypath_new(ctx, value, value_len, options, LY_VALUE_JSON, prefix_data, ctx_node,
                unres, &path, err);
    } else {
        ret = lyplg_type_lypath_new(ctx, value, value_len, options, format, prefix_data, ctx_node,
                unres, &path, err);
    }
    LY_CHECK_GOTO(ret, cleanup);

    /* store value */
    storage->target = path;

    /* check status */
    ret = lyplg_type_lypath_check_status(ctx_node, path, format, prefix_data, err);
    LY_CHECK_GOTO(ret, cleanup);

    /* store canonical value */
    if (format == LY_VALUE_CANON) {
        if (options & LYPLG_TYPE_STORE_DYNAMIC) {
            ret = lydict_insert_zc(ctx, (char *)value, &storage->_canonical);
            options &= ~LYPLG_TYPE_STORE_DYNAMIC;
            LY_CHECK_GOTO(ret, cleanup);
        } else {
            ret = lydict_insert(ctx, value, value_len, &storage->_canonical);
            LY_CHECK_GOTO(ret, cleanup);
        }
    } else {
        /* JSON format with prefix is the canonical one */
        ret = instanceid_path2str(path, LY_VALUE_JSON, NULL, &canon);
        LY_CHECK_GOTO(ret, cleanup);

        ret = lydict_insert_zc(ctx, canon, &storage->_canonical);
        LY_CHECK_GOTO(ret, cleanup);
    }

cleanup:
    if (options & LYPLG_TYPE_STORE_DYNAMIC) {
        free((void *)value);
    }

    if (ret) {
        lyplg_type_free_instanceid(ctx, storage);
    }
    if (!ret && type_inst->require_instance) {
        /* needs to be resolved */
        return LY_EINCOMPLETE;
    } else {
        return ret;
    }
}